

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pipe.c
# Opt level: O2

int nni_plat_pipe_open(int *wfd,int *rfd)

{
  int iVar1;
  undefined8 in_RAX;
  int *piVar2;
  undefined8 local_28;
  int fds [2];
  
  local_28 = in_RAX;
  iVar1 = pipe((int *)&local_28);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar1 = nni_plat_errno(*piVar2);
  }
  else {
    *wfd = local_28._4_4_;
    *rfd = (int)local_28;
    iVar1 = 0;
    fcntl((int)local_28,2,1);
    fcntl(local_28._4_4_,2,1);
    fcntl((int)local_28,4,0x800);
    fcntl(local_28._4_4_,4,0x800);
  }
  return iVar1;
}

Assistant:

int
nni_plat_pipe_open(int *wfd, int *rfd)
{
	int fds[2];

	if (pipe(fds) < 0) {
		return (nni_plat_errno(errno));
	}
	*wfd = fds[1];
	*rfd = fds[0];

	(void) fcntl(fds[0], F_SETFD, FD_CLOEXEC);
	(void) fcntl(fds[1], F_SETFD, FD_CLOEXEC);
	(void) fcntl(fds[0], F_SETFL, O_NONBLOCK);
	(void) fcntl(fds[1], F_SETFL, O_NONBLOCK);

	return (0);
}